

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PositionInfo.cpp
# Opt level: O3

string * __thiscall
PositionInfo::GetStringPosition_abi_cxx11_(string *__return_storage_ptr__,PositionInfo *this)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  long *plVar4;
  uint uVar5;
  long *plVar6;
  ulong uVar7;
  uint uVar8;
  string __str_3;
  string __str;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  undefined1 *local_58 [2];
  undefined1 local_48 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_38;
  
  local_38 = &__return_storage_ptr__->field_2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,"\"(","");
  uVar1 = this->firstLine;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar7 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar8 = uVar3;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001246bb;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001246bb;
      }
      if (uVar5 < 10000) goto LAB_001246bb;
      uVar7 = uVar7 / 10000;
      uVar3 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_001246bb:
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar8 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_58[0] + (uVar1 >> 0x1f),uVar8,uVar2);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_68 = *plVar6;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar6;
    local_78 = (long *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  uVar1 = this->firstColumn;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar7 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar8 = uVar3;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001247d9;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001247d9;
      }
      if (uVar5 < 10000) goto LAB_001247d9;
      uVar7 = uVar7 / 10000;
      uVar3 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_001247d9:
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar8 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_58[0] + (uVar1 >> 0x1f),uVar8,uVar2);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_68 = *plVar6;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar6;
    local_78 = (long *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  uVar1 = this->lastLine;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar7 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar8 = uVar3;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_001248f6;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_001248f6;
      }
      if (uVar5 < 10000) goto LAB_001248f6;
      uVar7 = uVar7 / 10000;
      uVar3 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_001248f6:
  local_58[0] = local_48;
  std::__cxx11::string::_M_construct((ulong)local_58,(char)uVar8 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>(local_58[0] + (uVar1 >> 0x1f),uVar8,uVar2);
  plVar4 = (long *)std::__cxx11::string::append((char *)local_58);
  plVar6 = plVar4 + 2;
  if ((long *)*plVar4 == plVar6) {
    local_68 = *plVar6;
    lStack_60 = plVar4[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar6;
    local_78 = (long *)*plVar4;
  }
  local_70 = plVar4[1];
  *plVar4 = (long)plVar6;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  if (local_58[0] != local_48) {
    operator_delete(local_58[0]);
  }
  uVar1 = this->lastColumn;
  uVar2 = -uVar1;
  if (0 < (int)uVar1) {
    uVar2 = uVar1;
  }
  uVar8 = 1;
  if (9 < uVar2) {
    uVar7 = (ulong)uVar2;
    uVar3 = 4;
    do {
      uVar8 = uVar3;
      uVar5 = (uint)uVar7;
      if (uVar5 < 100) {
        uVar8 = uVar8 - 2;
        goto LAB_00124a14;
      }
      if (uVar5 < 1000) {
        uVar8 = uVar8 - 1;
        goto LAB_00124a14;
      }
      if (uVar5 < 10000) goto LAB_00124a14;
      uVar7 = uVar7 / 10000;
      uVar3 = uVar8 + 4;
    } while (99999 < uVar5);
    uVar8 = uVar8 + 1;
  }
LAB_00124a14:
  local_78 = &local_68;
  std::__cxx11::string::_M_construct((ulong)&local_78,(char)uVar8 - (char)((int)uVar1 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar1 >> 0x1f) + (long)local_78),uVar8,uVar2);
  std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_78);
  if (local_78 != &local_68) {
    operator_delete(local_78);
  }
  std::__cxx11::string::append((char *)__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

std::string PositionInfo::GetStringPosition() const {
	std::string result = "\"(";
	result += std::to_string(firstLine) + ",";
	result += std::to_string(firstColumn) + ") : (";
	result += std::to_string(lastLine) + ",";
	result += std::to_string(lastColumn);
	result += ")\"";
	return result;
}